

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<ot::commissioner::Error> *
testing::internal::ActionResultHolder<ot::commissioner::Error>::
PerformAction<ot::commissioner::Error()>
          (Action<ot::commissioner::Error_()> *action,ArgumentTuple *args)

{
  ActionResultHolder<ot::commissioner::Error> *pAVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *local_60;
  size_type local_50;
  undefined8 uStack_48;
  ErrorCode local_40 [2];
  size_type *local_38;
  size_type local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  pAVar1 = (ActionResultHolder<ot::commissioner::Error> *)operator_new(0x30);
  Action<ot::commissioner::Error_()>::Perform(local_40,action);
  if (local_38 == (size_type *)&local_28) {
    uStack_48 = uStack_20;
    local_60 = &local_50;
  }
  else {
    local_60 = local_38;
  }
  local_50 = CONCAT71(uStack_27,local_28);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_0039fbf8;
  (pAVar1->result_).value_.mCode = local_40[0];
  paVar2 = &(pAVar1->result_).value_.mMessage.field_2;
  (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)paVar2;
  if (local_60 == &local_50) {
    paVar2->_M_allocated_capacity = local_50;
    *(undefined8 *)((long)&(pAVar1->result_).value_.mMessage.field_2 + 8) = uStack_48;
  }
  else {
    (pAVar1->result_).value_.mMessage._M_dataplus._M_p = (pointer)local_60;
    (pAVar1->result_).value_.mMessage.field_2._M_allocated_capacity = local_50;
  }
  (pAVar1->result_).value_.mMessage._M_string_length = local_30;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }